

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsPort.cpp
# Opt level: O1

long __thiscall AmsPort::DelNotification(AmsPort *this,AmsAddr ams,uint32_t hNotify)

{
  int iVar1;
  iterator __position;
  long lVar2;
  key_type local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    local_38.first = ams;
    local_38.second = hNotify;
    __position = std::
                 _Rb_tree<std::pair<const_AmsAddr,_const_unsigned_int>,_std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>,_std::_Select1st<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>,_std::less<std::pair<const_AmsAddr,_const_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>_>
                 ::find(&(this->dispatcherList)._M_t,&local_38);
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->dispatcherList)._M_t._M_impl.super__Rb_tree_header) {
      lVar2 = 0x752;
    }
    else {
      lVar2 = NotificationDispatcher::Erase
                        ((NotificationDispatcher *)__position._M_node[1]._M_left,hNotify,this->tmms)
      ;
      std::
      _Rb_tree<std::pair<const_AmsAddr,_const_unsigned_int>,_std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>,_std::_Select1st<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>,_std::less<std::pair<const_AmsAddr,_const_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>_>
      ::_M_erase_aux(&(this->dispatcherList)._M_t,(const_iterator)__position._M_node);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return lVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

long AmsPort::DelNotification(const AmsAddr ams, uint32_t hNotify)
{
    std::lock_guard<std::mutex> lock(mutex);
    auto it = dispatcherList.find({ams, hNotify});
    if (it != dispatcherList.end()) {
        const auto status = it->second->Erase(hNotify, tmms);
        dispatcherList.erase(it);
        return status;
    }
    return ADSERR_CLIENT_REMOVEHASH;
}